

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

int __thiscall TiXmlElement::QueryBoolAttribute(TiXmlElement *this,char *name,bool *bval)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  TiXmlAttribute *pTVar4;
  
  pTVar4 = &(this->attributeSet).sentinel;
  do {
    pTVar4 = pTVar4->next;
    if (pTVar4 == &(this->attributeSet).sentinel) {
      return 1;
    }
    iVar2 = strcmp(((pTVar4->name).rep_)->str,name);
  } while (iVar2 != 0);
  bVar1 = TiXmlBase::StringEqual(((pTVar4->value).rep_)->str,"true",true,TIXML_ENCODING_UNKNOWN);
  bVar3 = true;
  if (((!bVar1) &&
      (bVar1 = TiXmlBase::StringEqual(((pTVar4->value).rep_)->str,"yes",true,TIXML_ENCODING_UNKNOWN)
      , !bVar1)) &&
     (bVar1 = TiXmlBase::StringEqual(((pTVar4->value).rep_)->str,"1",true,TIXML_ENCODING_UNKNOWN),
     !bVar1)) {
    bVar3 = false;
    bVar1 = TiXmlBase::StringEqual(((pTVar4->value).rep_)->str,"false",true,TIXML_ENCODING_UNKNOWN);
    if (!bVar1) {
      bVar3 = false;
      bVar1 = TiXmlBase::StringEqual(((pTVar4->value).rep_)->str,"no",true,TIXML_ENCODING_UNKNOWN);
      if (!bVar1) {
        bVar3 = false;
        bVar1 = TiXmlBase::StringEqual(((pTVar4->value).rep_)->str,"0",true,TIXML_ENCODING_UNKNOWN);
        if (!bVar1) {
          return 2;
        }
      }
    }
  }
  *bval = bVar3;
  return 0;
}

Assistant:

int TiXmlElement::QueryBoolAttribute( const char* name, bool* bval ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;
	
	int result = TIXML_WRONG_TYPE;
	if (    StringEqual( node->Value(), "true", true, TIXML_ENCODING_UNKNOWN ) 
		 || StringEqual( node->Value(), "yes", true, TIXML_ENCODING_UNKNOWN ) 
		 || StringEqual( node->Value(), "1", true, TIXML_ENCODING_UNKNOWN ) ) 
	{
		*bval = true;
		result = TIXML_SUCCESS;
	}
	else if (    StringEqual( node->Value(), "false", true, TIXML_ENCODING_UNKNOWN ) 
			  || StringEqual( node->Value(), "no", true, TIXML_ENCODING_UNKNOWN ) 
			  || StringEqual( node->Value(), "0", true, TIXML_ENCODING_UNKNOWN ) ) 
	{
		*bval = false;
		result = TIXML_SUCCESS;
	}
	return result;
}